

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O2

StringRef __thiscall llvm::StringRef::rtrim(StringRef *this,char Char)

{
  size_t sVar1;
  ulong uVar2;
  size_type sVar3;
  ulong uVar4;
  ulong uVar5;
  StringRef SVar6;
  
  sVar1 = this->Length;
  sVar3 = find_last_not_of(this,Char,0xffffffffffffffff);
  uVar2 = this->Length;
  uVar5 = sVar3 + 1;
  if (uVar2 <= sVar3 + 1) {
    uVar5 = uVar2;
  }
  uVar5 = sVar1 - uVar5;
  uVar4 = uVar2 - uVar5;
  if (uVar5 <= uVar2) {
    if (uVar2 < uVar4) {
      uVar4 = uVar2;
    }
    SVar6.Length = uVar4;
    SVar6.Data = this->Data;
    return SVar6;
  }
  __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                ,0x28f,"StringRef llvm::StringRef::drop_back(size_t) const");
}

Assistant:

LLVM_NODISCARD
    StringRef rtrim(char Char) const {
      return drop_back(Length - std::min(Length, find_last_not_of(Char) + 1));
    }